

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  ImFont *this_local;
  
  ImVector<float>::ImVector(&this->IndexAdvanceX);
  ImVector<unsigned_short>::ImVector(&this->IndexLookup);
  ImVector<ImFontGlyph>::ImVector(&this->Glyphs);
  this->FontSize = 0.0;
  this->FallbackAdvanceX = 0.0;
  this->FallbackChar = 0x3f;
  this->EllipsisChar = 0xffff;
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->ConfigData = (ImFontConfig *)0x0;
  this->ConfigDataCount = 0;
  this->DirtyLookupTables = false;
  this->Scale = 1.0;
  this->Descent = 0.0;
  this->Ascent = 0.0;
  this->MetricsTotalSurface = 0;
  memset(this->Used4kPagesMap,0,2);
  return;
}

Assistant:

ImFont::ImFont()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    FallbackChar = (ImWchar)'?';
    EllipsisChar = (ImWchar)-1;
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    ConfigData = NULL;
    ConfigDataCount = 0;
    DirtyLookupTables = false;
    Scale = 1.0f;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
}